

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O0

void mserialize::detail::
     BuiltinDeserializer<std::unique_ptr<Person,_std::default_delete<Person>_>,_void>::
     deserialize<InputStream>
               (unique_ptr<Person,_std::default_delete<Person>_> *opt,InputStream *istream)

{
  Person *in_RSI;
  uint8_t discriminator;
  uint7 in_stack_ffffffffffffffe8;
  char in_stack_ffffffffffffffef;
  
  deserialize<unsigned_char,InputStream>
            ((uchar *)in_RSI,
             (InputStream *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
  if (in_stack_ffffffffffffffef == '\0') {
    std::unique_ptr<Person,_std::default_delete<Person>_>::operator=
              ((unique_ptr<Person,_std::default_delete<Person>_> *)in_RSI,
               (nullptr_t)(ulong)in_stack_ffffffffffffffe8);
  }
  else {
    BuiltinDeserializer<std::unique_ptr<Person,std::default_delete<Person>>,void>::
    make_nonempty<std::unique_ptr<Person,std::default_delete<Person>>>
              ((unique_ptr<Person,_std::default_delete<Person>_> *)in_RSI);
    std::unique_ptr<Person,_std::default_delete<Person>_>::operator*
              ((unique_ptr<Person,_std::default_delete<Person>_> *)in_RSI);
    deserialize<Person,InputStream>
              (in_RSI,(InputStream *)CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
  }
  return;
}

Assistant:

static void deserialize(Optional& opt, InputStream& istream)
  {
    std::uint8_t discriminator;
    mserialize::deserialize(discriminator, istream);
    if (discriminator)
    {
      assert(discriminator == 1 && "Discriminator of non-empty optional must be 1");
      make_nonempty(opt);
      mserialize::deserialize(*opt, istream);
    }
    else
    {
      opt = {};
    }
  }